

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeMSRMask(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  uint in_ESI;
  MCInst *in_RDI;
  uint Mask;
  uint ValLow;
  uint64_t FeatureBits;
  DecodeStatus S;
  DecodeStatus local_2c;
  
  local_2c = MCDisassembler_Success;
  uVar4 = ARM_getFeatureBits(in_RDI->csh->mode);
  if ((uVar4 & 0x4000) == 0) {
    if (in_ESI == 0) {
      return MCDisassembler_Fail;
    }
  }
  else {
    uVar1 = in_ESI & 0xff;
    if (((3 < uVar1) && (4 < uVar1 - 5)) && (uVar1 != 0x10)) {
      if (uVar1 - 0x11 < 3) {
        if ((uVar4 & 0x10000000000) == 0) {
          return MCDisassembler_Fail;
        }
      }
      else if (uVar1 != 0x14) {
        return MCDisassembler_Fail;
      }
    }
    uVar2 = MCInst_getOpcode(in_RDI);
    if (uVar2 == 0x9a5) {
      uVar3 = fieldFromInstruction_4(in_ESI,10,2);
      if ((uVar4 & 0x10000000000) == 0) {
        if (uVar3 != 2) {
          local_2c = MCDisassembler_SoftFail;
        }
      }
      else if (((uVar3 == 0) || ((uVar3 != 2 && (3 < uVar1)))) ||
              (((uVar4 & 0x80) == 0 && ((uVar3 & 1) != 0)))) {
        local_2c = MCDisassembler_SoftFail;
      }
    }
  }
  MCOperand_CreateImm0(in_RDI,(ulong)in_ESI);
  return local_2c;
}

Assistant:

static DecodeStatus DecodeMSRMask(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	uint64_t FeatureBits = ARM_getFeatureBits(Inst->csh->mode);
	if (FeatureBits & ARM_FeatureMClass) {
		unsigned ValLow = Val & 0xff;

		// Validate the SYSm value first.
		switch (ValLow) {
			case  0: // apsr
			case  1: // iapsr
			case  2: // eapsr
			case  3: // xpsr
			case  5: // ipsr
			case  6: // epsr
			case  7: // iepsr
			case  8: // msp
			case  9: // psp
			case 16: // primask
			case 20: // control
				break;
			case 17: // basepri
			case 18: // basepri_max
			case 19: // faultmask
				if (!(FeatureBits & ARM_HasV7Ops))
					// Values basepri, basepri_max and faultmask are only valid for v7m.
					return MCDisassembler_Fail;
				break;
			default:
				return MCDisassembler_Fail;
		}

		if (MCInst_getOpcode(Inst) == ARM_t2MSR_M) {
			unsigned Mask = fieldFromInstruction_4(Val, 10, 2);
			if (!(FeatureBits & ARM_HasV7Ops)) {
				// The ARMv6-M MSR bits {11-10} can be only 0b10, other values are
				// unpredictable.
				if (Mask != 2)
					S = MCDisassembler_SoftFail;
			}
			else {
				// The ARMv7-M architecture stores an additional 2-bit mask value in
				// MSR bits {11-10}. The mask is used only with apsr, iapsr, eapsr and
				// xpsr, it has to be 0b10 in other cases. Bit mask{1} indicates if
				// the NZCVQ bits should be moved by the instruction. Bit mask{0}
				// indicates the move for the GE{3:0} bits, the mask{0} bit can be set
				// only if the processor includes the DSP extension.
				if (Mask == 0 || (Mask != 2 && ValLow > 3) ||
						(!(FeatureBits & ARM_FeatureDSPThumb2) && (Mask & 1)))
					S = MCDisassembler_SoftFail;
			}
		}
	} else {
		// A/R class
		if (Val == 0)
			return MCDisassembler_Fail;
	}

	MCOperand_CreateImm0(Inst, Val);
	return S;
}